

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

void __thiscall CTPNTargetprop::gen_code(CTPNTargetprop *this,int discard,int param_2)

{
  int iVar1;
  int iVar2;
  CTcGenTarg *pCVar3;
  size_t in_RCX;
  undefined4 in_register_00000014;
  void *__buf;
  undefined4 in_register_00000034;
  
  if ((G_cs->field_0xa8 & 1) == 0) {
    CTcTokenizer::log_error
              (0x2d1e,CONCAT44(in_register_00000034,discard),CONCAT44(in_register_00000014,param_2))
    ;
  }
  if (discard == 0) {
    CTcGenTarg::write_op(G_cg,0x8e);
    CTcDataStream::write(&G_cs->super_CTcDataStream,1,__buf,in_RCX);
    pCVar3 = G_cg;
    iVar2 = G_cg->sp_depth_;
    iVar1 = iVar2 + 1;
    G_cg->sp_depth_ = iVar1;
    if (pCVar3->max_sp_depth_ <= iVar2) {
      pCVar3->max_sp_depth_ = iVar1;
    }
  }
  return;
}

Assistant:

void CTPNTargetprop::gen_code(int discard, int)
{
    /* it's an error if we're not in a method context */
    if (!G_cs->is_self_available())
        G_tok->log_error(TCERR_TARGETPROP_NOT_AVAIL);

    /* if we're not discarding the result, push the target property ID */
    if (!discard)
    {
        G_cg->write_op(OPC_PUSHCTXELE);
        G_cs->write(PUSHCTXELE_TARGPROP);
        G_cg->note_push();
    }
}